

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O3

void __thiscall MemSizeCalculator::calculate(MemSizeCalculator *this)

{
  _Hash_node_base *p_Var1;
  SymbolTable *pSVar2;
  _Hash_node_base *p_Var3;
  Function **function;
  _Hash_node_base *p_Var4;
  
  pSVar2 = this->symbolTable;
  p_Var3 = (pSVar2->classes)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      calculateClass(this,(Class *)p_Var3[5]._M_nxt);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
    pSVar2 = this->symbolTable;
  }
  p_Var3 = (pSVar2->freeFunctions)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var3[6]._M_nxt;
      for (p_Var4 = p_Var3[5]._M_nxt; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
        calculateFunction(this,(Function *)p_Var4->_M_nxt);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
    pSVar2 = this->symbolTable;
  }
  calculateFunction(this,pSVar2->main);
  return;
}

Assistant:

void MemSizeCalculator::calculate() {
    for (auto &_class : symbolTable->classes) calculateClass(_class.second);
    for (auto &functions: symbolTable->freeFunctions)
        for (auto &function : functions.second) calculateFunction(function);

    //calculate mem size for main function
    calculateFunction(symbolTable->main);
}